

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttrListImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::VecAttrListImpl::getType(VecAttrListImpl *this,XMLCh *name)

{
  bool bVar1;
  AttTypes attrType;
  XMLAttr *this_00;
  XMLCh *pXVar2;
  MemoryManager *manager;
  XMLAttr *curElem;
  XMLSize_t index;
  XMLCh *name_local;
  VecAttrListImpl *this_local;
  
  curElem = (XMLAttr *)0x0;
  while( true ) {
    if ((XMLAttr *)this->fCount <= curElem) {
      return (XMLCh *)0x0;
    }
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                         (XMLSize_t)curElem);
    pXVar2 = XMLAttr::getQName(this_00);
    bVar1 = XMLString::equals(pXVar2,name);
    if (bVar1) break;
    curElem = (XMLAttr *)&curElem->field_0x1;
  }
  attrType = XMLAttr::getType(this_00);
  manager = BaseRefVectorOf<xercesc_4_0::XMLAttr>::getMemoryManager
                      (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
  pXVar2 = XMLAttDef::getAttTypeString(attrType,manager);
  return pXVar2;
}

Assistant:

const XMLCh* VecAttrListImpl::getType(const XMLCh* const name) const
{
    //
    //  Search the vector for the attribute with the given name and return
    //  its type.
    //
    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const XMLAttr* curElem = fVector->elementAt(index);

        if (XMLString::equals(curElem->getQName(), name))
            return XMLAttDef::getAttTypeString(curElem->getType(), fVector->getMemoryManager());
    }
    return 0;
}